

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::JunitReporter::testRunStarting(JunitReporter *this,TestRunInfo *runInfo)

{
  uint64_t uVar1;
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"testsuites",&local_31);
  XmlWriter::startElement(&this->xml,&local_30,Newline|Indent);
  std::__cxx11::string::~string((string *)&local_30);
  uVar1 = std::chrono::_V2::system_clock::now();
  (this->suiteTimer).m_nanoseconds = uVar1;
  (this->stdOutForSuite)._M_string_length = 0;
  *(this->stdOutForSuite)._M_dataplus._M_p = '\0';
  (this->stdErrForSuite)._M_string_length = 0;
  *(this->stdErrForSuite)._M_dataplus._M_p = '\0';
  this->unexpectedExceptions = 0;
  return;
}

Assistant:

void JunitReporter::testRunStarting( TestRunInfo const& runInfo )  {
        CumulativeReporterBase::testRunStarting( runInfo );
        xml.startElement( "testsuites" );
        suiteTimer.start();
        stdOutForSuite.clear();
        stdErrForSuite.clear();
        unexpectedExceptions = 0;
    }